

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O2

void __thiscall
flatbuffers::swift::SwiftGenerator::GenUnsafeBufferPointer(SwiftGenerator *this,FieldDef *field)

{
  allocator<char> local_92;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"functionName",&local_91);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"withUnsafePointerTo",&local_92);
  Namer::Variable<flatbuffers::FieldDef>(&local_30,&(this->namer_).super_Namer,&local_50,field);
  CodeWriter::SetValue(&this->code_,&local_90,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,
             "{{ACCESS_TYPE}} func {{functionName}}<T>(_ body: (UnsafeRawBufferPointer) throws -> T) rethrows -> T? { return try {{ACCESS}}.withUnsafePointerToSlice(at: {{TABLEOFFSET}}.{{OFFSET}}.v, body: body) }"
             ,(allocator<char> *)&local_90);
  CodeWriter::operator+=(&this->code_,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void GenUnsafeBufferPointer(const FieldDef &field) {
    code_.SetValue("functionName",
                   namer_.Variable("withUnsafePointerTo", field));
    code_ +=
        "{{ACCESS_TYPE}} func {{functionName}}<T>(_ body: "
        "(UnsafeRawBufferPointer) throws -> T) rethrows -> T? { return try "
        "{{ACCESS}}.withUnsafePointerToSlice(at: {{TABLEOFFSET}}.{{OFFSET}}.v, "
        "body: body) }";
  }